

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  LYS_NODE LVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  unres_schema *unres_00;
  int iVar10;
  int iVar11;
  lys_node *plVar12;
  lys_node *plVar13;
  char *pcVar14;
  lys_iffeature *plVar15;
  uint8_t *__dest;
  lys_feature **pplVar16;
  LY_ERR *pLVar17;
  lys_when *plVar18;
  lys_restr *plVar19;
  void *pvVar20;
  lys_module *plVar21;
  lys_node *plVar22;
  lys_node *plVar23;
  lys_ext_instance **pplVar24;
  lys_ext_instance *plVar25;
  lys_ext *plVar26;
  undefined8 *new_item;
  ushort uVar27;
  undefined8 uVar28;
  lys_node *plVar29;
  lys_node *plVar30;
  lys_node *plVar31;
  ulong uVar32;
  lys_node *plVar33;
  size_t __size;
  lys_node *new_item_00;
  lys_node *plVar34;
  undefined4 uVar35;
  ulong uVar36;
  lys_iffeature *plVar37;
  ly_ctx *plVar38;
  long lVar39;
  uint local_ac;
  lys_node *plStack_a8;
  uint size1;
  lys_node *local_a0;
  lys_node *local_98;
  lys_node *local_90;
  uint local_84;
  lys_node *plStack_80;
  uint size2;
  lys_node_list *list_orig;
  lys_node *local_70;
  lys_module *local_68;
  unres_schema *local_60;
  lys_node *local_58;
  undefined4 local_4c;
  ly_ctx *local_48;
  lys_node *local_40;
  lys_node *local_38;
  
  plVar38 = module->ctx;
  LVar4 = node->nodetype;
  list_orig = (lys_node_list *)CONCAT44(list_orig._4_4_,finalize);
  local_48 = (ly_ctx *)CONCAT44(local_48._4_4_,shallow);
  plStack_80 = node;
  local_38 = node;
  if ((int)LVar4 < 0x80) {
    if ((int)LVar4 < 0x10) {
      switch(LVar4) {
      case LYS_CONTAINER:
        plVar12 = (lys_node *)calloc(1,0x88);
        local_90 = (lys_node *)0x0;
        local_70 = (lys_node *)0x0;
        local_98 = (lys_node *)0x0;
        local_58 = (lys_node *)0x0;
        plVar13 = (lys_node *)0x0;
        plStack_a8 = (lys_node *)0x0;
        plVar33 = plVar12;
        break;
      case LYS_CHOICE:
        plVar12 = (lys_node *)calloc(1,0x78);
        local_70 = (lys_node *)0x0;
        local_98 = (lys_node *)0x0;
        local_58 = (lys_node *)0x0;
        plVar13 = (lys_node *)0x0;
        plStack_a8 = (lys_node *)0x0;
        plVar33 = (lys_node *)0x0;
        local_90 = plVar12;
        break;
      default:
        goto switchD_0015719d_caseD_3;
      case LYS_LEAF:
        local_70 = (lys_node *)calloc(1,200);
        local_98 = (lys_node *)0x0;
        local_58 = (lys_node *)0x0;
        plVar13 = (lys_node *)0x0;
        plStack_a8 = (lys_node *)0x0;
        plVar12 = local_70;
        plVar33 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        break;
      case LYS_LEAFLIST:
        local_98 = (lys_node *)calloc(1,0xd0);
        local_70 = (lys_node *)0x0;
        local_58 = (lys_node *)0x0;
        plVar13 = (lys_node *)0x0;
        plStack_a8 = (lys_node *)0x0;
        plVar12 = local_98;
        plVar33 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
      }
LAB_001572d8:
      plVar23 = (lys_node *)0x0;
    }
    else {
      if (LVar4 == LYS_LIST) {
        local_58 = (lys_node *)calloc(1,0xa0);
        local_70 = (lys_node *)0x0;
        local_98 = (lys_node *)0x0;
        plVar13 = (lys_node *)0x0;
        plStack_a8 = (lys_node *)0x0;
        plVar12 = local_58;
        plVar33 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        goto LAB_001572d8;
      }
      if (LVar4 == LYS_ANYXML) {
LAB_00157292:
        plVar13 = (lys_node *)calloc(1,0x78);
        local_70 = (lys_node *)0x0;
        local_98 = (lys_node *)0x0;
        local_58 = (lys_node *)0x0;
        plStack_a8 = (lys_node *)0x0;
        plVar12 = plVar13;
        plVar33 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        goto LAB_001572d8;
      }
      if (LVar4 != LYS_CASE) goto switchD_0015719d_caseD_3;
      plVar12 = (lys_node *)calloc(1,0x70);
      plVar33 = (lys_node *)0x0;
      local_90 = (lys_node *)0x0;
      local_70 = (lys_node *)0x0;
      local_98 = (lys_node *)0x0;
      local_58 = (lys_node *)0x0;
      plVar13 = (lys_node *)0x0;
      plStack_a8 = (lys_node *)0x0;
      plVar23 = plVar12;
    }
    plVar29 = local_38;
    if (plVar12 == (lys_node *)0x0) {
      pLVar17 = ly_errno_location();
      *pLVar17 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      return (lys_node *)0x0;
    }
    local_a0 = parent;
    pcVar14 = lydict_insert(plVar38,local_38->name,0);
    plVar12->name = pcVar14;
    pcVar14 = lydict_insert(plVar38,plVar29->dsc,0);
    plVar12->dsc = pcVar14;
    pcVar14 = lydict_insert(plVar38,plVar29->ref,0);
    plVar12->ref = pcVar14;
    plVar12->flags = plVar29->flags;
    plVar12->module = module;
    plVar12->nodetype = plVar29->nodetype;
    plVar12->prev = plVar12;
    uVar1 = plVar29->ext_size;
    plVar12->ext_size = uVar1;
    iVar10 = lys_ext_dup(module,plVar29->ext,uVar1,plVar12,LYEXT_PAR_NODE,&plVar12->ext,unres);
    if (iVar10 != 0) goto LAB_00157399;
    bVar2 = plVar29->iffeature_size;
    local_40 = plVar12;
    if ((ulong)bVar2 != 0) {
      plVar12->iffeature_size = bVar2;
      plVar15 = (lys_iffeature *)calloc((ulong)bVar2,0x20);
      plVar12->iffeature = plVar15;
      if (plVar15 != (lys_iffeature *)0x0) {
        if ((int)local_48 != 0) goto LAB_001575c1;
        local_4c = (undefined4)CONCAT71((int7)((ulong)plVar15 >> 8),(int)local_48 == 0);
        uVar32 = 0;
        local_68 = module;
        local_60 = unres;
        local_48 = plVar38;
        do {
          plVar12 = local_38;
          resolve_iffeature_getsizes(local_38->iffeature + uVar32,&local_ac,&local_84);
          plVar15 = plVar12->iffeature;
          plVar37 = local_40->iffeature;
          if (local_ac != 0) {
            uVar36 = (ulong)((local_ac & 3) != 0 || local_ac >> 2 != 0);
            __dest = (uint8_t *)malloc(uVar36);
            plVar37[uVar32].expr = __dest;
            memcpy(__dest,plVar15[uVar32].expr,uVar36);
            uVar36 = (ulong)local_84;
            pplVar16 = (lys_feature **)calloc(uVar36,8);
            plVar37[uVar32].features = pplVar16;
            module = local_68;
            if (uVar36 != 0) {
              lVar39 = 0;
              uVar36 = 0;
              do {
                plVar29 = local_38;
                plVar12 = local_40;
                iVar10 = unres_schema_dup(local_68,local_60,
                                          (void *)((long)local_38->iffeature[uVar32].features +
                                                  lVar39),UNRES_IFFEAT,
                                          (void *)((long)local_40->iffeature[uVar32].features +
                                                  lVar39));
                if (iVar10 == 1) {
                  *(undefined8 *)((long)plVar12->iffeature[uVar32].features + lVar39) =
                       *(undefined8 *)((long)plVar29->iffeature[uVar32].features + lVar39);
                }
                else {
                  plVar12 = local_40;
                  if (iVar10 == -1) goto LAB_00157399;
                }
                uVar36 = uVar36 + 1;
                lVar39 = lVar39 + 8;
              } while (uVar36 < local_84);
              plVar15 = local_38->iffeature;
              plVar37 = local_40->iffeature;
              module = local_68;
            }
          }
          unres = local_60;
          uVar1 = plVar15[uVar32].ext_size;
          plVar37[uVar32].ext_size = uVar1;
          iVar10 = lys_ext_dup(module,plVar15[uVar32].ext,uVar1,plVar37 + uVar32,LYEXT_PAR_IFFEATURE
                               ,&plVar37[uVar32].ext,local_60);
          plVar12 = local_40;
          if (iVar10 != 0) goto LAB_00157399;
          uVar32 = uVar32 + 1;
          plVar38 = local_48;
        } while (uVar32 < local_38->iffeature_size);
LAB_001577b0:
        plVar34 = local_38;
        plVar12 = local_40;
        uVar27 = 1;
        plVar29 = local_a0;
        do {
          while( true ) {
            plVar30 = plVar29;
            if (plVar30 == (lys_node *)0x0) goto LAB_00157807;
            if (plVar30->nodetype != LYS_USES) break;
            plVar29 = plVar30->parent;
          }
          if ((plVar30->nodetype != LYS_AUGMENT) ||
             (plVar29 = plVar30->parent, plVar29 == (lys_node *)0x0)) break;
          if (plVar29->nodetype == LYS_AUGMENT) {
            plVar29 = plVar29->prev;
          }
        } while (plVar29 != (lys_node *)0x0);
        uVar27 = plVar30->flags & 3;
LAB_00157807:
        if ((int)list_orig == 2) {
          uVar27 = local_40->flags & 0xfff8;
LAB_0015790d:
          local_40->flags = uVar27;
        }
        else if ((int)list_orig == 1) {
          uVar3 = local_40->flags;
          if ((uVar3 & 4) == 0) {
            if (local_40->nodetype != LYS_USES) {
              uVar27 = uVar3 & 0xfff8 | uVar27;
              goto LAB_0015790d;
            }
          }
          else if (((uVar27 & 2) != 0) && ((uVar3 & 1) != 0)) {
            ly_vlog(LYE_INARG,LY_VLOG_LYS,local_40,"true","config");
            ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                    "State nodes cannot have configuration nodes as children.");
            goto LAB_00157399;
          }
        }
        iVar10 = lys_node_addchild(local_a0,local_40->module,local_40);
        if (iVar10 != 0) goto LAB_00157399;
        plVar29 = plStack_a8;
        plVar30 = local_70;
        new_item_00 = local_90;
        if ((plVar34->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          for (plVar34 = local_38->child; plVar34 != (lys_node *)0x0; plVar34 = plVar34->next) {
            if ((plVar34->nodetype & LYS_GROUPING) == LYS_UNKNOWN) {
              plVar22 = lys_node_dup_recursion(module,plVar12,plVar34,unres,0,(int)list_orig);
              plVar29 = plStack_a8;
              plVar30 = local_70;
              new_item_00 = local_90;
              if (plVar22 == (lys_node *)0x0) goto LAB_00157399;
            }
          }
        }
        plVar34 = local_38;
        uVar35 = local_4c;
        if (((((int)list_orig == 1) && (plVar12->nodetype == LYS_LIST)) &&
            ((plVar12->flags & 1) != 0)) && (local_38->padding[2] == '\0')) {
          ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_LYS,plVar12,"key","list");
          goto LAB_00157399;
        }
        goto LAB_001575f2;
      }
LAB_00158087:
      pLVar17 = ly_errno_location();
      *pLVar17 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      goto LAB_00157399;
    }
    if ((int)local_48 == 0) {
      local_4c = 1;
      goto LAB_001577b0;
    }
LAB_001575c1:
    plVar34 = local_38;
    memcpy(plVar12->iffeature,local_38->iffeature,(ulong)plVar12->iffeature_size << 5);
    plVar29 = plStack_a8;
    plVar30 = local_70;
    new_item_00 = local_90;
    uVar35 = 0;
LAB_001575f2:
    plVar31 = local_58;
    plVar22 = plStack_80;
    LVar4 = plVar34->nodetype;
    if ((int)LVar4 < 0x80) {
      if ((int)LVar4 < 0x10) {
        local_68 = module;
        switch(LVar4) {
        case LYS_CONTAINER:
          if ((lys_when *)plVar34[1].name != (lys_when *)0x0) {
            plVar18 = lys_when_dup(module,(lys_when *)plVar34[1].name,unres);
            plVar33[1].name = (char *)plVar18;
          }
          plVar21 = local_68;
          pcVar14 = lydict_insert(plVar38,*(char **)&plVar34[1].flags,0);
          *(char **)&plVar33[1].flags = pcVar14;
          bVar2 = plVar34->padding[2];
          plVar33->padding[2] = bVar2;
          plVar19 = lys_restr_dup(plVar21,(lys_restr *)plVar34[1].dsc,(uint)bVar2,unres);
          plVar33[1].dsc = (char *)plVar19;
          return plVar12;
        case LYS_CHOICE:
          if ((lys_when *)plVar34[1].name != (lys_when *)0x0) {
            plVar18 = lys_when_dup(module,(lys_when *)plVar34[1].name,unres);
            local_90[1].name = (char *)plVar18;
            new_item_00 = local_90;
          }
          pcVar14 = plVar34[1].dsc;
          if ((char)uVar35 == '\0') {
            new_item_00[1].dsc = pcVar14;
            return plVar12;
          }
          if (pcVar14 == (char *)0x0) {
            unres_schema_dup(module,unres,plVar34,UNRES_CHOICE_DFLT,new_item_00);
            return plVar12;
          }
          plVar21 = plVar12->module;
          if ((plVar21->field_0x40 & 1) != 0) {
            plVar21 = (lys_module *)plVar21->data;
          }
          iVar10 = lys_get_sibling(new_item_00->child,plVar21->name,0,*(char **)pcVar14,0,0x807d,
                                   (lys_node **)&new_item_00[1].dsc);
          if (iVar10 == 0) {
            return plVar12;
          }
          pLVar17 = ly_errno_location();
          *pLVar17 = LY_EINT;
          uVar28 = 0xb9b;
          goto LAB_0015774f;
        default:
          goto switchD_00157625_caseD_3;
        case LYS_LEAF:
          local_48 = plVar38;
          iVar10 = ingrouping(plVar12);
          iVar10 = lys_type_dup(module,plVar12,(lys_type *)&plVar30[1].ref,
                                (lys_type *)&plVar34[1].ref,iVar10,unres);
          plVar33 = local_38;
          plVar12 = local_40;
          if (iVar10 == 0) {
            plVar12 = (lys_node *)lydict_insert(module->ctx,(char *)local_38[1].next,0);
            local_70[1].next = plVar12;
            if (plVar33[1].prev != (lys_node *)0x0) {
              plVar12 = (lys_node *)lydict_insert(local_48,(char *)plVar33[1].prev,0);
              local_70[1].prev = plVar12;
              iVar10 = ingrouping(local_40);
              iVar11._0_2_ = local_70[1].flags;
              iVar11._2_1_ = local_70[1].ext_size;
              iVar11._3_1_ = local_70[1].iffeature_size;
              if (iVar10 == 0 || iVar11 != 9) {
                plVar21 = module;
                if (iVar11 == 7) {
                  plVar21 = plVar33->module;
                }
                iVar10 = unres_schema_add_node
                                   (plVar21,unres,&plVar30[1].ref,UNRES_TYPE_DFLT,
                                    (lys_node *)&local_70[1].prev);
                plVar12 = local_40;
                if (iVar10 == -1) break;
              }
            }
            bVar2 = plVar33->padding[3];
            local_70->padding[3] = bVar2;
            plVar19 = lys_restr_dup(module,(lys_restr *)plVar33[1].dsc,(uint)bVar2,unres);
            plVar12 = local_70;
            local_70[1].dsc = (char *)plVar19;
            if ((lys_when *)plVar33[1].name == (lys_when *)0x0) {
              return local_40;
            }
            plVar18 = lys_when_dup(module,(lys_when *)plVar33[1].name,unres);
            plVar12[1].name = (char *)plVar18;
            return local_40;
          }
          break;
        case LYS_LEAFLIST:
          plVar33 = local_98 + 1;
          local_60 = unres;
          iVar10 = ingrouping(plVar12);
          unres_00 = local_60;
          iVar10 = lys_type_dup(module,plVar12,(lys_type *)&plVar33->ref,(lys_type *)&plVar34[1].ref
                                ,iVar10,local_60);
          plVar13 = local_38;
          plVar12 = local_40;
          if (iVar10 == 0) {
            list_orig = (lys_node_list *)&plVar33->ref;
            local_48 = plVar38;
            plVar12 = (lys_node *)lydict_insert(module->ctx,(char *)local_38[1].next,0);
            plVar33 = local_98;
            local_98[1].next = plVar12;
            *(undefined4 *)&local_98[1].priv = *(undefined4 *)&plVar13[1].priv;
            *(undefined4 *)((long)&local_98[1].priv + 4) =
                 *(undefined4 *)((long)&plVar13[1].priv + 4);
            bVar2 = plVar13->padding[3];
            local_98->padding[3] = bVar2;
            plVar19 = lys_restr_dup(module,(lys_restr *)plVar13[1].dsc,(uint)bVar2,unres_00);
            plVar33[1].dsc = (char *)plVar19;
            bVar2 = plVar13->padding[2];
            plVar33->padding[2] = bVar2;
            plVar23 = (lys_node *)malloc((ulong)((uint)bVar2 * 8));
            plVar12 = local_40;
            plVar33[1].prev = plVar23;
            if (bVar2 != 0) {
              lVar39 = 0;
              uVar32 = 0;
              do {
                pcVar14 = lydict_insert(local_48,*(char **)((plVar13[1].prev)->padding +
                                                           lVar39 + -0x1c),0);
                *(char **)((plVar33[1].prev)->padding + lVar39 + -0x1c) = pcVar14;
                iVar11 = ingrouping(plVar12);
                module = local_68;
                iVar10._0_2_ = plVar33[1].flags;
                iVar10._2_1_ = plVar33[1].ext_size;
                iVar10._3_1_ = plVar33[1].iffeature_size;
                if (iVar11 == 0 || iVar10 != 9) {
                  plVar33 = plVar33[1].prev;
                  if (((iVar10 != 7) ||
                      (pcVar14 = strchr(*(char **)(plVar33->padding + lVar39 + -0x1c),0x3a),
                      pcVar14 != (char *)0x0)) || (plVar21 = local_38->module, plVar21 == module)) {
                    plVar21 = module;
                  }
                  iVar10 = unres_schema_add_node
                                     (plVar21,local_60,list_orig,UNRES_TYPE_DFLT,
                                      (lys_node *)(plVar33->padding + lVar39 + -0x1c));
                  plVar13 = local_38;
                  plVar33 = local_98;
                  if (iVar10 == -1) goto LAB_00157399;
                }
                uVar32 = uVar32 + 1;
                lVar39 = lVar39 + 8;
              } while (uVar32 < plVar33->padding[2]);
            }
            if ((lys_when *)plVar13[1].name == (lys_when *)0x0) {
              return plVar12;
            }
            plVar18 = lys_when_dup(module,(lys_when *)plVar13[1].name,local_60);
            plVar33[1].name = (char *)plVar18;
            return plVar12;
          }
        }
        goto LAB_00157399;
      }
      if (LVar4 == LYS_LIST) {
        *(undefined4 *)&local_58[1].iffeature = *(undefined4 *)&plStack_80[1].iffeature;
        *(undefined4 *)((long)&local_58[1].iffeature + 4) =
             *(undefined4 *)((long)&plStack_80[1].iffeature + 4);
        bVar2 = plStack_80->padding[0];
        local_58->padding[0] = bVar2;
        local_4c = uVar35;
        local_48 = plVar38;
        plVar19 = lys_restr_dup(module,(lys_restr *)plStack_80[1].dsc,(uint)bVar2,unres);
        plVar33 = local_a0;
        plVar31[1].dsc = (char *)plVar19;
        bVar2 = plVar22->padding[2];
        plVar31->padding[2] = bVar2;
        if ((ulong)bVar2 != 0) {
          pvVar20 = calloc((ulong)bVar2,8);
          *(void **)&local_58[1].flags = pvVar20;
          plVar21 = (lys_module *)lydict_insert(local_48,(char *)plVar22[1].module,0);
          local_58[1].module = plVar21;
          if (*(void **)&local_58[1].flags == (void *)0x0) goto LAB_00158087;
          if ((char)local_4c == '\0') {
            memcpy(*(void **)&local_58[1].flags,*(void **)&plVar22[1].flags,
                   (ulong)local_58->padding[2] << 3);
            plVar31 = local_58;
          }
          else {
            for (; plVar33 != (lys_node *)0x0; plVar33 = plVar33->parent) {
              plVar31 = local_58;
              if (plVar33->nodetype == LYS_GROUPING) goto LAB_00157f21;
            }
            iVar10 = unres_schema_add_node(module,unres,local_58,UNRES_LIST_KEYS,(lys_node *)0x0);
            plVar31 = local_58;
            if (iVar10 == -1) goto LAB_00157399;
          }
        }
LAB_00157f21:
        bVar2 = plVar22->padding[3];
        plVar31->padding[3] = bVar2;
        local_68 = module;
        pplVar24 = (lys_ext_instance **)malloc((ulong)bVar2 << 4);
        local_58[1].ext = pplVar24;
        if (pplVar24 != (lys_ext_instance **)0x0) {
          if (bVar2 != 0) {
            uVar32 = (ulong)bVar2;
            plVar33 = (lys_node *)0x0;
            local_60 = unres;
            do {
              local_38 = (lys_node *)CONCAT44(local_38._4_4_,(int)uVar32);
              bVar2 = *(byte *)(plStack_80[1].ext + (long)plVar33 * 2 + 1);
              *(byte *)(pplVar24 + (long)plVar33 * 2 + 1) = bVar2;
              plVar25 = (lys_ext_instance *)malloc((ulong)bVar2 << 3);
              plVar38 = local_48;
              plVar13 = local_58;
              pplVar24[(long)plVar33 * 2] = plVar25;
              if (plVar25 == (lys_ext_instance *)0x0) goto LAB_00158087;
              uVar32 = (ulong)local_38 & 0xffffffff;
              if (bVar2 != 0) {
                uVar32 = 0;
                local_38 = plVar33;
                do {
                  plVar26 = (lys_ext *)
                            lydict_insert(plVar38,(char *)(&plStack_80[1].ext[(long)plVar33 * 2]->
                                                            def)[uVar32],0);
                  (&plVar13[1].ext[(long)plVar33 * 2]->def)[uVar32] = plVar26;
                  new_item = (undefined8 *)malloc(0x18);
                  *new_item = plVar13;
                  pplVar24 = plVar13[1].ext;
                  new_item[1] = (&pplVar24[(long)plVar33 * 2]->def)[uVar32];
                  new_item[2] = (long)(pplVar24 + (long)plVar33 * 2) + 9;
                  uVar28 = 0;
                  unres_schema_dup(local_68,local_60,&stack0xffffffffffffff80,UNRES_LIST_UNIQ,
                                   new_item);
                  uVar32 = uVar32 + 1;
                  pplVar24 = plVar13[1].ext;
                } while (uVar32 < *(byte *)(pplVar24 + (long)plVar33 * 2 + 1));
                uVar32 = CONCAT71((int7)((ulong)uVar28 >> 8),plVar13->padding[3]);
                plVar12 = local_40;
                plVar33 = local_38;
              }
              plVar33 = (lys_node *)((long)&plVar33->name + 1);
              plVar22 = plStack_80;
              unres = local_60;
            } while (plVar33 < (lys_node *)(uVar32 & 0xff));
          }
          plVar18 = (lys_when *)plVar22[1].name;
          plVar29 = local_58;
          module = local_68;
joined_r0x0015779c:
          if (plVar18 == (lys_when *)0x0) {
            return plVar12;
          }
          plVar18 = lys_when_dup(module,plVar18,unres);
          plVar29[1].name = (char *)plVar18;
          return plVar12;
        }
        goto LAB_00158087;
      }
      if (LVar4 == LYS_ANYXML) {
LAB_001578b8:
        bVar2 = plVar34->padding[3];
        plVar13->padding[3] = bVar2;
        plVar19 = lys_restr_dup(module,(lys_restr *)plVar34[1].dsc,(uint)bVar2,unres);
        plVar13[1].dsc = (char *)plVar19;
        plVar18 = (lys_when *)plVar34[1].name;
        plVar29 = plVar13;
        goto joined_r0x0015779c;
      }
      if (LVar4 == LYS_CASE) {
        if ((lys_when *)plVar34[1].name == (lys_when *)0x0) {
          return plVar12;
        }
        plVar18 = lys_when_dup(module,(lys_when *)plVar34[1].name,unres);
        plVar23[1].name = (char *)plVar18;
        return plVar12;
      }
    }
    else if ((int)LVar4 < 0x400) {
      if (LVar4 == LYS_NOTIF) {
        return plVar12;
      }
      if (LVar4 == LYS_RPC) {
        return plVar12;
      }
      if (LVar4 == LYS_INPUT) {
        return plVar12;
      }
    }
    else if ((int)LVar4 < 0x4000) {
      if (LVar4 == LYS_OUTPUT) {
        return plVar12;
      }
      if (LVar4 == LYS_USES) {
        uVar1 = plVar34[1].ext_size;
        uVar5 = plVar34[1].iffeature_size;
        uVar6 = plVar34[1].padding[0];
        uVar7 = plVar34[1].padding[1];
        uVar8 = plVar34[1].padding[2];
        uVar9 = plVar34[1].padding[3];
        plVar29[1].flags = plVar34[1].flags;
        plVar29[1].ext_size = uVar1;
        plVar29[1].iffeature_size = uVar5;
        plVar29[1].padding[0] = uVar6;
        plVar29[1].padding[1] = uVar7;
        plVar29[1].padding[2] = uVar8;
        plVar29[1].padding[3] = uVar9;
        plVar18 = (lys_when *)plVar34[1].name;
        goto joined_r0x0015779c;
      }
    }
    else {
      if (LVar4 == LYS_ACTION) {
        return plVar12;
      }
      if (LVar4 == LYS_ANYDATA) goto LAB_001578b8;
    }
switchD_00157625_caseD_3:
    pLVar17 = ly_errno_location();
    *pLVar17 = LY_EINT;
    uVar28 = 0xc4b;
  }
  else {
    if ((int)LVar4 < 0x400) {
      if (LVar4 != LYS_NOTIF) {
        if (LVar4 == LYS_RPC) goto LAB_001572b6;
        if (LVar4 != LYS_INPUT) goto switchD_0015719d_caseD_3;
      }
LAB_00157274:
      __size = 0x78;
LAB_001572c0:
      plVar12 = (lys_node *)calloc(1,__size);
      local_70 = (lys_node *)0x0;
      local_98 = (lys_node *)0x0;
      local_58 = (lys_node *)0x0;
      plVar13 = (lys_node *)0x0;
      plStack_a8 = (lys_node *)0x0;
      plVar33 = (lys_node *)0x0;
      local_90 = (lys_node *)0x0;
      goto LAB_001572d8;
    }
    if ((int)LVar4 < 0x4000) {
      if (LVar4 == LYS_OUTPUT) goto LAB_00157274;
      if (LVar4 == LYS_USES) {
        plStack_a8 = (lys_node *)calloc(1,0x88);
        local_70 = (lys_node *)0x0;
        local_98 = (lys_node *)0x0;
        local_58 = (lys_node *)0x0;
        plVar13 = (lys_node *)0x0;
        plVar12 = plStack_a8;
        plVar33 = (lys_node *)0x0;
        local_90 = (lys_node *)0x0;
        goto LAB_001572d8;
      }
    }
    else {
      if (LVar4 == LYS_ACTION) {
LAB_001572b6:
        __size = 0x70;
        goto LAB_001572c0;
      }
      if (LVar4 == LYS_ANYDATA) goto LAB_00157292;
    }
switchD_0015719d_caseD_3:
    pLVar17 = ly_errno_location();
    *pLVar17 = LY_EINT;
    plVar12 = (lys_node *)0x0;
    uVar28 = 0xaf1;
  }
LAB_0015774f:
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
         ,uVar28);
LAB_00157399:
  lys_node_free(plVar12,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct lys_module *tmp_mod;
    struct ly_ctx *ctx = module->ctx;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT;
        goto error;
    }

    if (!retval) {
        LOGMEM;
        return NULL;
    }

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    retval->ext_size = node->ext_size;
    if (lys_ext_dup(module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, unres)) {
        goto error;
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        if (!retval->iffeature) {
            LOGMEM;
            goto error;
        }
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = lys_parent(iter)));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, unres);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        cont->must_size = cont_orig->must_size;
        cont->must = lys_restr_dup(module, cont_orig->must, cont->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, unres);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT;
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            if (!ingrouping(retval) || (leaf->type.base != LY_TYPE_LEAFREF)) {
                /* problem is when it is an identityref referencing an identity from a module
                 * and we are using the grouping in a different module */
                if (leaf->type.base == LY_TYPE_IDENT) {
                    tmp_mod = leaf_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &leaf->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&leaf->dflt)) == -1) {
                    goto error;
                }
            }
        }

        leaf->must_size = leaf_orig->must_size;
        leaf->must = lys_restr_dup(module, leaf_orig->must, leaf->must_size, unres);

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, unres);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        llist->must_size = llist_orig->must_size;
        llist->must = lys_restr_dup(module, llist_orig->must, llist->must_size, unres);

        llist->dflt_size = llist_orig->dflt_size;
        llist->dflt = malloc(llist->dflt_size * sizeof *llist->dflt);
        for (i = 0; i < llist->dflt_size; i++) {
            llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            if (!ingrouping(retval) || (llist->type.base != LY_TYPE_LEAFREF)) {
                if ((llist->type.base == LY_TYPE_IDENT) && !strchr(llist->dflt[i], ':') && (module != llist_orig->module)) {
                    tmp_mod = llist_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &llist->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&llist->dflt[i])) == -1) {
                    goto error;
                }
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        list->must_size = list_orig->must_size;
        list->must = lys_restr_dup(module, list_orig->must, list->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        list->keys_size = list_orig->keys_size;
        if (list->keys_size) {
            list->keys = calloc(list->keys_size, sizeof *list->keys);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            if (!list->keys) {
                LOGMEM;
                goto error;
            }

            if (!shallow) {
                /* the keys are going to be resolved only if the list is instantiated in data tree, not just
                 * in another grouping */
                for (iter = parent; iter && iter->nodetype != LYS_GROUPING; iter = iter->parent);
                if (!iter && unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list->keys_size * sizeof *list->keys);
            }
        }

        list->unique_size = list_orig->unique_size;
        list->unique = malloc(list->unique_size * sizeof *list->unique);
        if (!list->unique) {
            LOGMEM;
            goto error;
        }
        for (i = 0; i < list->unique_size; ++i) {
            list->unique[i].expr_size = list_orig->unique[i].expr_size;
            list->unique[i].expr = malloc(list->unique[i].expr_size * sizeof *list->unique[i].expr);
            if (!list->unique[i].expr) {
                LOGMEM;
                goto error;
            }
            for (j = 0; j < list->unique[i].expr_size; j++) {
                list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                /* if it stays in unres list, duplicate it also there */
                unique_info = malloc(sizeof *unique_info);
                unique_info->list = (struct lys_node *)list;
                unique_info->expr = list->unique[i].expr[j];
                unique_info->trg_type = &list->unique[i].trg_type;
                unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, unres);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any->must_size = any_orig->must_size;
        any->must = lys_restr_dup(module, any_orig->must, any->must_size, unres);

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, unres);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, unres);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, unres);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT;
        goto error;
    }

    return retval;

error:

    lys_node_free(retval, NULL, 0);
    return NULL;
}